

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

natwm_error string_find_first_nonspace(char *string,size_t *index_result)

{
  ushort **ppuVar1;
  size_t sVar2;
  natwm_error nVar3;
  char cVar4;
  
  if (string == (char *)0x0) {
    nVar3 = INVALID_INPUT_ERROR;
  }
  else {
    cVar4 = *string;
    nVar3 = NOT_FOUND_ERROR;
    if (cVar4 != '\0') {
      ppuVar1 = __ctype_b_loc();
      sVar2 = 0;
      do {
        if ((*(byte *)((long)*ppuVar1 + (long)cVar4 * 2 + 1) & 0x20) == 0) {
          *index_result = sVar2;
          return NO_ERROR;
        }
        cVar4 = string[sVar2 + 1];
        sVar2 = sVar2 + 1;
      } while (cVar4 != '\0');
    }
  }
  return nVar3;
}

Assistant:

enum natwm_error string_find_first_nonspace(const char *string, size_t *index_result)
{
        if (string == NULL) {
                return INVALID_INPUT_ERROR;
        }

        char ch = '\0';
        size_t index = 0;

        while ((ch = string[index]) != '\0' && isspace(ch)) {
                ++index;
        }

        if (ch == '\0') {
                // Reached the end of the line without finding a nonspace char
                return NOT_FOUND_ERROR;
        }

        *index_result = index;

        return NO_ERROR;
}